

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeutils.cc
# Opt level: O0

int64_t rtc::TmToSeconds(tm *tm)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bool local_34;
  bool local_33;
  bool expiry_in_leap_year;
  int sec;
  int min;
  int hour;
  int day;
  int month;
  int year;
  tm *tm_local;
  
  iVar5 = tm->tm_year + 0x76c;
  iVar1 = tm->tm_mon;
  iVar6 = tm->tm_mday + -1;
  iVar2 = tm->tm_hour;
  iVar3 = tm->tm_min;
  iVar4 = tm->tm_sec;
  local_33 = false;
  if (iVar5 % 4 == 0) {
    local_33 = iVar5 % 100 != 0 || iVar5 % 400 == 0;
  }
  if (iVar5 < 0x7b2) {
    tm_local = (tm *)0xffffffffffffffff;
  }
  else if ((iVar1 < 0) || (0xb < iVar1)) {
    tm_local = (tm *)0xffffffffffffffff;
  }
  else if ((iVar6 < 0) ||
          (local_34 = local_33 && iVar1 == 1,
          (int)((int)TmToSeconds::mdays[iVar1] + (uint)local_34) <= iVar6)) {
    tm_local = (tm *)0xffffffffffffffff;
  }
  else if ((iVar2 < 0) || (0x17 < iVar2)) {
    tm_local = (tm *)0xffffffffffffffff;
  }
  else if ((iVar3 < 0) || (0x3b < iVar3)) {
    tm_local = (tm *)0xffffffffffffffff;
  }
  else if ((iVar4 < 0) || (0x3b < iVar4)) {
    tm_local = (tm *)0xffffffffffffffff;
  }
  else {
    min = (iVar5 / 4 - (iVar5 / 100 + -0x13)) + iVar5 / 400 + -0x1f0 +
          TmToSeconds::cumul_mdays[iVar1] + iVar6;
    if ((local_33) && (iVar1 < 2)) {
      min = min + -1;
    }
    tm_local = (tm *)(((((long)(tm->tm_year + -0x46) * 0x16d + (long)min) * 0x18 + (long)iVar2) *
                       0x3c + (long)iVar3) * 0x3c + (long)iVar4);
  }
  return (int64_t)tm_local;
}

Assistant:

int64_t TmToSeconds(const std::tm& tm) {
  static short int mdays[12] = {31, 28, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31};
  static short int cumul_mdays[12] = {0,   31,  59,  90,  120, 151,
                                      181, 212, 243, 273, 304, 334};
  int year = tm.tm_year + 1900;
  int month = tm.tm_mon;
  int day = tm.tm_mday - 1;  // Make 0-based like the rest.
  int hour = tm.tm_hour;
  int min = tm.tm_min;
  int sec = tm.tm_sec;

  bool expiry_in_leap_year = (year % 4 == 0 &&
                              (year % 100 != 0 || year % 400 == 0));

  if (year < 1970)
    return -1;
  if (month < 0 || month > 11)
    return -1;
  if (day < 0 || day >= mdays[month] + (expiry_in_leap_year && month == 2 - 1))
    return -1;
  if (hour < 0 || hour > 23)
    return -1;
  if (min < 0 || min > 59)
    return -1;
  if (sec < 0 || sec > 59)
    return -1;

  day += cumul_mdays[month];

  // Add number of leap days between 1970 and the expiration year, inclusive.
  day += ((year / 4 - 1970 / 4) - (year / 100 - 1970 / 100) +
          (year / 400 - 1970 / 400));

  // We will have added one day too much above if expiration is during a leap
  // year, and expiration is in January or February.
  if (expiry_in_leap_year && month <= 2 - 1) // |month| is zero based.
    day -= 1;

  // Combine all variables into seconds from 1970-01-01 00:00 (except |month|
  // which was accumulated into |day| above).
  return (((static_cast<int64_t>
            (year - 1970) * 365 + day) * 24 + hour) * 60 + min) * 60 + sec;
}